

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall String::join(String *this,List<String> *tokens,char separator)

{
  bool bVar1;
  Iterator *pIVar2;
  String *str;
  Iterator local_30;
  Iterator end;
  Iterator i;
  char separator_local;
  List<String> *tokens_local;
  String *this_local;
  
  clear(this);
  bVar1 = List<String>::isEmpty(tokens);
  if (!bVar1) {
    pIVar2 = List<String>::begin(tokens);
    end.item = pIVar2->item;
    pIVar2 = List<String>::end(tokens);
    local_30.item = pIVar2->item;
    while( true ) {
      str = List<String>::Iterator::operator*(&end);
      append(this,str);
      pIVar2 = List<String>::Iterator::operator++(&end);
      bVar1 = List<String>::Iterator::operator==(pIVar2,&local_30);
      if (bVar1) break;
      append(this,separator);
    }
  }
  return this;
}

Assistant:

String& String::join(const List<String>& tokens, char separator)
{
  clear();
  if(!tokens.isEmpty())
    for(List<String>::Iterator i = tokens.begin(), end = tokens.end();;)
    {
      append(*i);
      if(++i == end)
        break;
      append(separator);
    }
  return *this;
}